

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::DoInterruptProbes(Lowerer *this)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  undefined4 *puVar4;
  LabelInstr *this_00;
  LabelInstr *loopLabel;
  bool local_51;
  LabelInstr *newLabel;
  LabelInstr *labelInstr;
  Instr *instr;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  uint instrCount;
  Lowerer *this_local;
  
  Func::SetHasInstrNumber(this->m_func,true);
  __prevInstrCheck._4_4_ = 1;
  instrStop = (Instr *)0x0;
  labelInstr = (LabelInstr *)this->m_func->m_headInstr;
  do {
    if (labelInstr == (LabelInstr *)0x0) {
      return;
    }
    if ((instrStop != (Instr *)0x0) && ((LabelInstr *)instrStop->m_next != labelInstr)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x157c,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    instrStop = &labelInstr->super_Instr;
    IR::Instr::SetNumber(&labelInstr->super_Instr,__prevInstrCheck._4_4_);
    IVar3 = IR::Instr::GetKind(&labelInstr->super_Instr);
    local_51 = true;
    if (IVar3 != InstrKindLabel) {
      local_51 = IR::Instr::IsProfiledLabelInstr(&labelInstr->super_Instr);
    }
    if ((local_51 != false) &&
       (this_00 = IR::Instr::AsLabelInstr(&labelInstr->super_Instr), (this_00->field_0x78 & 1) != 0)
       ) {
      loopLabel = IR::LabelInstr::New(Label,this->m_func,false);
      IR::Instr::InsertAfter(&this_00->super_Instr,&loopLabel->super_Instr);
      InsertOneLoopProbe(this,&loopLabel->super_Instr,loopLabel);
    }
    labelInstr = (LabelInstr *)(labelInstr->super_Instr).m_next;
    __prevInstrCheck._4_4_ = __prevInstrCheck._4_4_ + 1;
  } while( true );
}

Assistant:

void
Lowerer::DoInterruptProbes()
{
    this->m_func->SetHasInstrNumber(true);
    uint instrCount = 1;
    FOREACH_INSTR_IN_FUNC(instr, this->m_func)
    {
        instr->SetNumber(instrCount++);
        if (instr->IsLabelInstr())
        {
            IR::LabelInstr *labelInstr = instr->AsLabelInstr();
            if (labelInstr->m_isLoopTop)
            {
                // For every loop top label, insert the following:

                //   cmp sp, ThreadContext::stackLimitForCurrentThread
                //   bgt $continue
                // $helper:
                //   call JavascriptOperators::ScriptAbort
                //   b $exit
                // $continue:

                IR::LabelInstr *newLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
                labelInstr->InsertAfter(newLabel);
                this->InsertOneLoopProbe(newLabel, newLabel);
            }
        }
    }
    NEXT_INSTR_IN_FUNC;
}